

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O2

ngx_int_t ngx_parse_url(ngx_pool_t *pool,ngx_url_t *u)

{
  uchar *addr;
  uint uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  ushort uVar7;
  in_addr_t iVar8;
  ngx_int_t nVar9;
  u_char *puVar10;
  u_char *puVar11;
  u_char *puVar12;
  char *pcVar13;
  u_char *puVar14;
  ngx_addr_t *pnVar15;
  sockaddr *psVar16;
  u_char *puVar17;
  u_char *puVar18;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  in6_addr *__a;
  
  uVar20 = (u->url).len;
  puVar17 = (u->url).data;
  if (uVar20 < 5) {
    puVar18 = puVar17;
    if (uVar20 != 0) goto LAB_00118fa1;
    uVar20 = 0;
  }
  else {
    nVar9 = ngx_strncasecmp(puVar17,(u_char *)"unix:",5);
    uVar20 = (u->url).len;
    puVar18 = (u->url).data;
    if (nVar9 == 0) {
      puVar17 = puVar18 + 5;
      sVar19 = uVar20 - 5;
      if ((u->field_0x48 & 2) != 0) {
        puVar10 = ngx_strlchr(puVar17,puVar18 + uVar20,':');
        if (puVar10 != (u_char *)0x0) {
          sVar19 = (long)puVar10 - (long)puVar17;
          (u->uri).len = (long)(puVar18 + uVar20) - (long)(puVar10 + 1);
          (u->uri).data = puVar10 + 1;
        }
      }
      if (sVar19 == 0) {
        u->err = "no path in the unix domain socket";
        return -1;
      }
      uVar20 = sVar19 + 1;
      (u->host).len = sVar19;
      (u->host).data = puVar17;
      if (0x6c < uVar20) {
        u->err = "too long path in the unix domain socket";
        return -1;
      }
      u->socklen = 0x6e;
      (u->sockaddr).sockaddr.sa_family = 1;
      ngx_cpystrn((u_char *)&(u->sockaddr).sockaddr_in.sin_port,puVar17,uVar20);
      pnVar15 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar15;
      if (pnVar15 != (ngx_addr_t *)0x0) {
        psVar16 = (sockaddr *)ngx_pcalloc(pool,0x6e);
        if (psVar16 != (sockaddr *)0x0) {
          u->family = 1;
          u->naddrs = 1;
          psVar16->sa_family = 1;
          ngx_cpystrn((u_char *)psVar16->sa_data,puVar17,uVar20);
          pnVar15 = u->addrs;
          pnVar15->sockaddr = psVar16;
          pnVar15->socklen = 0x6e;
          (pnVar15->name).len = sVar19 + 5;
          (pnVar15->name).data = (u->url).data;
          return 0;
        }
        return -1;
      }
      return -1;
    }
LAB_00118fa1:
    if (*puVar17 == '[') {
      u->socklen = 0x1c;
      (u->sockaddr).sockaddr.sa_family = 10;
      puVar17 = puVar18 + 1;
      puVar10 = puVar18 + uVar20;
      puVar11 = ngx_strlchr(puVar17,puVar10,']');
      if (puVar11 == (u_char *)0x0) {
LAB_0011904c:
        pcVar13 = "invalid host";
LAB_00119053:
        u->err = pcVar13;
        return -1;
      }
      puVar14 = puVar11 + 1;
      puVar12 = ngx_strlchr(puVar14,puVar10,'/');
      if (puVar12 != (u_char *)0x0) {
        if ((u->field_0x48 & 3) != 2) goto LAB_0011904c;
        (u->uri).len = (long)puVar10 - (long)puVar12;
        (u->uri).data = puVar12;
        puVar10 = puVar12;
      }
      if (puVar14 < puVar10) {
        if (*puVar14 != ':') goto LAB_0011904c;
        puVar14 = puVar11 + 2;
        nVar9 = ngx_atoi(puVar14,(long)puVar10 - (long)puVar14);
        if (nVar9 - 0x10000U < 0xffffffffffff0001) {
          pcVar13 = "invalid port";
          goto LAB_00119053;
        }
        uVar7 = (ushort)nVar9;
        u->port = uVar7;
        (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
        (u->port_text).len = (long)puVar10 - (long)puVar14;
        (u->port_text).data = puVar14;
      }
      else {
        u->field_0x48 = u->field_0x48 | 8;
        uVar7 = u->default_port;
        u->port = uVar7;
        (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
      }
      sVar19 = (long)puVar11 - (long)puVar17;
      if (sVar19 == 0) {
        pcVar13 = "no host";
        goto LAB_00119053;
      }
      (u->host).len = sVar19 + 2;
      (u->host).data = puVar18;
      addr = (u->sockaddr).sockaddr_in.sin_zero;
      nVar9 = ngx_inet6_addr(puVar17,sVar19,addr);
      if (nVar9 != 0) {
        pcVar13 = "invalid IPv6 address";
        goto LAB_00119053;
      }
      if ((((*(int *)addr == 0) && (*(int *)((long)&u->sockaddr + 0xc) == 0)) &&
          (*(int *)((long)&u->sockaddr + 0x10) == 0)) && (*(int *)((long)&u->sockaddr + 0x14) == 0))
      {
        u->field_0x48 = u->field_0x48 | 0x10;
      }
      u->family = 10;
      u->naddrs = 1;
      pnVar15 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar15;
      if (pnVar15 == (ngx_addr_t *)0x0) {
        return -1;
      }
      psVar16 = (sockaddr *)ngx_pcalloc(pool,0x1c);
      if (psVar16 == (sockaddr *)0x0) {
        return -1;
      }
      uVar3 = *(undefined8 *)&u->sockaddr;
      uVar4 = *(undefined8 *)((long)&u->sockaddr + 8);
      uVar5 = *(undefined8 *)((long)&u->sockaddr + 0x14);
      *(undefined8 *)(psVar16->sa_data + 10) = *(undefined8 *)((long)&u->sockaddr + 0xc);
      *(undefined8 *)(psVar16[1].sa_data + 2) = uVar5;
      psVar16->sa_family = (short)uVar3;
      psVar16->sa_data[0] = (char)((ulong)uVar3 >> 0x10);
      psVar16->sa_data[1] = (char)((ulong)uVar3 >> 0x18);
      psVar16->sa_data[2] = (char)((ulong)uVar3 >> 0x20);
      psVar16->sa_data[3] = (char)((ulong)uVar3 >> 0x28);
      psVar16->sa_data[4] = (char)((ulong)uVar3 >> 0x30);
      psVar16->sa_data[5] = (char)((ulong)uVar3 >> 0x38);
      *(undefined8 *)(psVar16->sa_data + 6) = uVar4;
      pnVar15 = u->addrs;
      pnVar15->sockaddr = psVar16;
      pnVar15->socklen = 0x1c;
      sVar19 = (u->host).len;
      goto LAB_0011948e;
    }
  }
  u->socklen = 0x10;
  (u->sockaddr).sockaddr.sa_family = 2;
  u->family = 2;
  puVar17 = puVar18 + uVar20;
  puVar11 = ngx_strlchr(puVar18,puVar17,':');
  puVar14 = ngx_strlchr(puVar18,puVar17,'/');
  puVar12 = ngx_strlchr(puVar18,puVar17,'?');
  puVar10 = puVar14;
  if (puVar12 < puVar14) {
    puVar10 = puVar12;
  }
  if (puVar14 == (u_char *)0x0) {
    puVar10 = puVar12;
  }
  if (puVar12 == (u_char *)0x0) {
    puVar10 = puVar14;
  }
  if (puVar10 == (u_char *)0x0) {
    if (puVar11 != (u_char *)0x0) goto LAB_00119115;
    bVar6 = u->field_0x48;
    puVar10 = puVar17;
    if ((bVar6 & 1) == 0) {
LAB_001193a8:
      u->field_0x48 = bVar6 | 8;
      uVar7 = u->default_port;
      u->port = uVar7;
      (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
      puVar11 = puVar10;
      goto LAB_001193c1;
    }
    nVar9 = ngx_atoi(puVar18,uVar20);
    if (nVar9 == -1) {
      bVar6 = u->field_0x48;
      goto LAB_001193a8;
    }
    if (0xffffffffffff0000 < nVar9 - 0x10000U) {
      uVar7 = (ushort)nVar9;
      u->port = uVar7;
      (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
      (u->port_text).len = uVar20;
      (u->port_text).data = puVar18;
      u->field_0x48 = u->field_0x48 | 0x10;
      return 0;
    }
  }
  else {
    bVar6 = u->field_0x48;
    if ((bVar6 & 3) != 2) {
      u->err = "invalid host";
      return -1;
    }
    (u->uri).len = (long)puVar17 - (long)puVar10;
    (u->uri).data = puVar10;
    if ((puVar11 == (u_char *)0x0) || (puVar17 = puVar10, puVar10 < puVar11)) goto LAB_001193a8;
LAB_00119115:
    puVar10 = puVar11 + 1;
    nVar9 = ngx_atoi(puVar10,(long)puVar17 - (long)puVar10);
    if (0xffffffffffff0000 < nVar9 - 0x10000U) {
      uVar7 = (ushort)nVar9;
      u->port = uVar7;
      (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
      (u->port_text).len = (long)puVar17 - (long)puVar10;
      (u->port_text).data = puVar10;
LAB_001193c1:
      sVar19 = (long)puVar11 - (long)puVar18;
      if (sVar19 != 0) {
        (u->host).len = sVar19;
        (u->host).data = puVar18;
        bVar6 = u->field_0x48;
        if ((sVar19 == 1 && (bVar6 & 1) != 0) && (*puVar18 == '*')) {
          (u->sockaddr).sockaddr_in6.sin6_flowinfo = 0;
          u->field_0x48 = bVar6 | 0x10;
          return 0;
        }
        iVar8 = ngx_inet_addr(puVar18,sVar19);
        (u->sockaddr).sockaddr_in6.sin6_flowinfo = iVar8;
        if (iVar8 == 0xffffffff) {
          if ((bVar6 & 4) != 0) {
            return 0;
          }
          nVar9 = ngx_inet_resolve_host(pool,u);
          if (nVar9 != 0) {
            return -1;
          }
          psVar16 = u->addrs->sockaddr;
          uVar21 = (uint)psVar16->sa_family;
          u->family = uVar21;
          uVar1 = u->addrs->socklen;
          u->socklen = uVar1;
          memcpy(&u->sockaddr,psVar16,(ulong)uVar1);
          if (uVar21 == 10) {
            if (*(int *)((long)&u->sockaddr + 8) != 0) {
              return 0;
            }
            if (*(int *)((long)&u->sockaddr + 0xc) != 0) {
              return 0;
            }
            if (*(int *)((long)&u->sockaddr + 0x10) != 0) {
              return 0;
            }
            uVar2 = *(uint32_t *)((long)&u->sockaddr + 0x14);
          }
          else {
            uVar2 = (u->sockaddr).sockaddr_in6.sin6_flowinfo;
          }
          if (uVar2 != 0) {
            return 0;
          }
          u->field_0x48 = u->field_0x48 | 0x10;
          return 0;
        }
        if (iVar8 == 0) {
          u->field_0x48 = bVar6 | 0x10;
        }
        u->naddrs = 1;
        pnVar15 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
        u->addrs = pnVar15;
        if (pnVar15 == (ngx_addr_t *)0x0) {
          return -1;
        }
        psVar16 = (sockaddr *)ngx_pcalloc(pool,0x10);
        if (psVar16 == (sockaddr *)0x0) {
          return -1;
        }
        uVar3 = *(undefined8 *)&u->sockaddr;
        uVar4 = *(undefined8 *)((long)&u->sockaddr + 8);
        psVar16->sa_family = (short)uVar3;
        psVar16->sa_data[0] = (char)((ulong)uVar3 >> 0x10);
        psVar16->sa_data[1] = (char)((ulong)uVar3 >> 0x18);
        psVar16->sa_data[2] = (char)((ulong)uVar3 >> 0x20);
        psVar16->sa_data[3] = (char)((ulong)uVar3 >> 0x28);
        psVar16->sa_data[4] = (char)((ulong)uVar3 >> 0x30);
        psVar16->sa_data[5] = (char)((ulong)uVar3 >> 0x38);
        *(undefined8 *)(psVar16->sa_data + 6) = uVar4;
        pnVar15 = u->addrs;
        pnVar15->sockaddr = psVar16;
        pnVar15->socklen = 0x10;
        sVar19 = (u->host).len;
LAB_0011948e:
        puVar17 = (u_char *)ngx_pnalloc(pool,sVar19 + 6);
        if (puVar17 != (u_char *)0x0) {
          puVar18 = ngx_sprintf(puVar17,"%V:%d",&u->host,(ulong)u->port);
          pnVar15 = u->addrs;
          (pnVar15->name).len = (long)puVar18 - (long)puVar17;
          (pnVar15->name).data = puVar17;
          return 0;
        }
        return -1;
      }
      pcVar13 = "no host";
      goto LAB_001194d2;
    }
  }
  pcVar13 = "invalid port";
LAB_001194d2:
  u->err = pcVar13;
  return -1;
}

Assistant:

ngx_int_t
ngx_parse_url(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char  *p;
    size_t   len;

    p = u->url.data;
    len = u->url.len;

    if (len >= 5 && ngx_strncasecmp(p, (u_char *) "unix:", 5) == 0) {
        return ngx_parse_unix_domain_url(pool, u);
    }

    if (len && p[0] == '[') {
        return ngx_parse_inet6_url(pool, u);
    }

    return ngx_parse_inet_url(pool, u);
}